

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O1

void EMIT_OP_REG_RPTR(CodeGenGenericContext *ctx,x86Command op,x86Reg reg1,x86Size size,x86Reg index
                     ,int multiplier,x86Reg base,uint shift)

{
  ArgType AVar1;
  x86Instruction *pxVar2;
  x86Argument arg;
  x86Reg xVar3;
  uint uVar4;
  int iVar5;
  x86Reg xVar6;
  uint uVar7;
  int *piVar8;
  ulong uVar9;
  x86Argument address;
  int local_58;
  x86Reg local_54;
  x86Argument local_50;
  
  local_58 = multiplier;
  local_54 = index;
  if (ctx->skipTracking == false) {
    CodeGenGenericContext::RedirectAddressComputation(ctx,&local_54,&local_58,&base,&shift);
    ctx->genRegRead[base] = true;
    ctx->genRegRead[local_54] = true;
  }
  xVar6 = local_54;
  iVar5 = local_58;
  uVar4 = shift;
  xVar3 = base;
  local_50.type = argPtr;
  local_50.ptrBase = base;
  local_50.ptrIndex = local_54;
  local_50.ptrMult = local_58;
  local_50.ptrNum = shift;
  local_50.field_1.ptrSize = size;
  if (0x29 < (int)op) {
    uVar9 = (ulong)(op - o_cvttsd2si);
    if (op - o_cvttsd2si < 0x21) {
      if ((0x170e00001U >> (uVar9 & 0x3f) & 1) != 0) goto LAB_001e4657;
      if (uVar9 == 0x13) goto LAB_001e4752;
      if (uVar9 != 0x1f) goto LAB_001e472c;
    }
    else {
LAB_001e472c:
      if (op != o_cmp) {
        if (op != o_movsxd) {
LAB_001e48b1:
          __assert_fail("!\"unknown instruction\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                        ,0x622,
                        "void EMIT_OP_REG_RPTR(CodeGenGenericContext &, x86Command, x86Reg, x86Size, x86Reg, int, x86Reg, unsigned int)"
                       );
        }
LAB_001e4740:
        CodeGenGenericContext::MemRead(ctx,&local_50);
        goto LAB_001e4855;
      }
    }
    CodeGenGenericContext::MemRead(ctx,&local_50);
    ctx->genRegRead[reg1] = true;
    goto LAB_001e469f;
  }
  if ((int)op < 0x1f) {
    if ((int)op < 5) {
      if (op != o_mov) {
        if (op != o_movsx) goto LAB_001e48b1;
        goto LAB_001e4740;
      }
LAB_001e4752:
      if (ctx->skipTracking != false) goto LAB_001e469f;
      uVar7 = CodeGenGenericContext::MemFind(ctx,&local_50);
      if (uVar7 != 0) {
        uVar7 = uVar7 - 1;
        AVar1 = ctx->memCache[uVar7].value.type;
        if (AVar1 == argNumber) {
          EMIT_OP_REG_NUM(ctx,op,reg1,ctx->memCache[uVar7].value.field_1.labelID);
          return;
        }
        if (AVar1 == argReg) {
          if (ctx->memCache[uVar7].address.field_1.reg != (op != o_mov) + rECX) {
            __assert_fail("ctx.memCache[memIndex].address.ptrSize == (op == o_mov ? sDWORD : sQWORD)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                          ,0x5dc,
                          "void EMIT_OP_REG_RPTR(CodeGenGenericContext &, x86Command, x86Reg, x86Size, x86Reg, int, x86Reg, unsigned int)"
                         );
          }
          uVar9 = (ulong)ctx->memCache[uVar7].value.field_1.reg;
LAB_001e47e9:
          EMIT_OP_REG_REG(ctx,op,reg1,(x86Reg)uVar9);
          return;
        }
      }
      piVar8 = &ctx->genReg[0].ptrNum;
      uVar9 = 0;
      do {
        if (((((((x86Argument *)(piVar8 + -7))->type == argPtr) &&
              (((anon_union_8_6_73be8994_for_x86Argument_2 *)(piVar8 + -5))->reg == size)) &&
             (piVar8[-3] == xVar3)) && ((piVar8[-2] == xVar6 && (piVar8[-1] == iVar5)))) &&
           (*piVar8 == uVar4)) goto LAB_001e47e9;
        uVar9 = uVar9 + 1;
        piVar8 = piVar8 + 8;
      } while (uVar9 != 0x11);
      CodeGenGenericContext::MemRead(ctx,&local_50);
      if (xVar6 != reg1 && xVar3 != reg1) {
        arg._4_4_ = local_50._4_4_;
        arg.type = local_50.type;
        arg.field_1.imm64Arg._4_4_ = local_50.field_1.imm64Arg._4_4_;
        arg.field_1.ptrSize = local_50.field_1.reg;
        arg.ptrIndex = local_50.ptrIndex;
        arg.ptrBase = local_50.ptrBase;
        arg.ptrNum = local_50.ptrNum;
        arg.ptrMult = local_50.ptrMult;
        CodeGenGenericContext::OverwriteRegisterWithValue(ctx,reg1,arg);
        goto LAB_001e469f;
      }
    }
    else {
      if (op != o_lea) {
        if (op != o_add) goto LAB_001e48b1;
        goto LAB_001e4657;
      }
      if (local_54 == rNONE && shift == 0) {
        op = o_mov64;
        uVar9 = (ulong)base;
        goto LAB_001e47e9;
      }
    }
LAB_001e4855:
    CodeGenGenericContext::OverwriteRegisterWithUnknown(ctx,reg1);
  }
  else {
    if (((2 < op - o_and) && (op != o_sub)) && (op != o_imul)) goto LAB_001e48b1;
LAB_001e4657:
    CodeGenGenericContext::MemRead(ctx,&local_50);
    CodeGenGenericContext::InvalidateDependand(ctx,reg1);
    ctx->genReg[reg1].type = argNone;
    ctx->genRegUpdate[reg1] =
         (int)((ulong)((long)ctx->x86Op - (long)ctx->x86Base) >> 4) * -0x33333333;
    ctx->genRegRead[reg1] = false;
  }
LAB_001e469f:
  pxVar2 = ctx->x86Op;
  pxVar2->name = op;
  (pxVar2->argA).type = argReg;
  (pxVar2->argA).field_1.reg = reg1;
  pxVar2 = ctx->x86Op;
  (pxVar2->argB).type = argPtr;
  (pxVar2->argB).field_1.ptrSize = size;
  pxVar2 = ctx->x86Op;
  (pxVar2->argB).ptrIndex = xVar6;
  (pxVar2->argB).ptrMult = iVar5;
  (pxVar2->argB).ptrBase = xVar3;
  (pxVar2->argB).ptrNum = uVar4;
  ctx->x86Op = pxVar2 + 1;
  return;
}

Assistant:

void EMIT_OP_REG_RPTR(CodeGenGenericContext &ctx, x86Command op, x86Reg reg1, x86Size size, x86Reg index, int multiplier, x86Reg base, unsigned shift)
{
#ifdef NULLC_OPTIMIZE_X86
	if(!ctx.skipTracking)
	{
		ctx.RedirectAddressComputation(index, multiplier, base, shift);

		// Register reads
		ctx.ReadRegister(base);
		ctx.ReadRegister(index);
	}

	x86Argument address = x86Argument(size, index, multiplier, base, shift);

	switch(op)
	{
	case o_mov:
	case o_mov64:
		if(ctx.skipTracking)
			break;

		if(unsigned memIndex = ctx.MemFind(address))
		{
			memIndex--;

			if(ctx.memCache[memIndex].value.type == x86Argument::argReg)
			{
				assert(ctx.memCache[memIndex].address.ptrSize == (op == o_mov ? sDWORD : sQWORD));

				EMIT_OP_REG_REG(ctx, op, reg1, ctx.memCache[memIndex].value.reg);
				return;
			}
			else if(ctx.memCache[memIndex].value.type == x86Argument::argNumber)
			{
				EMIT_OP_REG_NUM(ctx, op, reg1, ctx.memCache[memIndex].value.num);
				return;
			}
		}

		// If another register contains data from memory
		for(unsigned i = 0; i < rRegCount; i++)
		{
			if(ctx.genReg[i].type == x86Argument::argPtr && ctx.genReg[i] == address)
			{
				EMIT_OP_REG_REG(ctx, op, reg1, (x86Reg)i);
				return;
			}
		}

		ctx.MemRead(address);

		// If write doesn't invalidate the source registers, mark that register contains value from source address
		if(reg1 != base && reg1 != index)
			ctx.OverwriteRegisterWithValue(reg1, address);
		else
			ctx.OverwriteRegisterWithUnknown(reg1);
		break;
	case o_movsx:
	case o_movsxd:
		ctx.MemRead(address);

		ctx.OverwriteRegisterWithUnknown(reg1);
		break;
	case o_lea:
		if(index == rNONE && shift == 0)
		{
			EMIT_OP_REG_REG(ctx, sizeof(void*) == 8 ? o_mov64 : o_mov, reg1, base);
			return;
		}

		ctx.OverwriteRegisterWithUnknown(reg1);
		break;
	case o_cvttsd2si:
	case o_cvttsd2si64:
	case o_add:
	case o_sub:
	case o_imul:
	case o_and:
	case o_or:
	case o_xor:
	case o_add64:
	case o_sub64:
	case o_imul64:
	case o_and64:
	case o_or64:
	case o_xor64:
		ctx.MemRead(address);

		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_cmp:
	case o_cmp64:
		ctx.MemRead(address);

		ctx.ReadRegister(reg1);
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argReg;
	ctx.x86Op->argA.reg = reg1;
	ctx.x86Op->argB.type = x86Argument::argPtr;
	ctx.x86Op->argB.ptrSize = size;
	ctx.x86Op->argB.ptrIndex = index;
	ctx.x86Op->argB.ptrMult = multiplier;
	ctx.x86Op->argB.ptrBase = base;
	ctx.x86Op->argB.ptrNum = shift;
	ctx.x86Op++;
}